

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generation_iterator.cpp
# Opt level: O0

void __thiscall
GenerationIterator_GenerationContainerBegin_Test::TestBody
          (GenerationIterator_GenerationContainerBegin_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_80;
  Message local_78 [3];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  not_null<const_pstore::database_*> local_48;
  undefined1 local_40 [8];
  generation_iterator expected;
  undefined1 local_28 [8];
  generation_iterator actual;
  database *d;
  GenerationIterator_GenerationContainerBegin_Test *this_local;
  
  anon_unknown.dwarf_e8c5d::GenerationIterator::add_transaction(&this->super_GenerationIterator);
  actual.pos_.a_.a_ =
       (address)anon_unknown.dwarf_e8c5d::GenerationIterator::db(&this->super_GenerationIterator);
  pstore::generation_container::generation_container
            ((generation_container *)&expected.pos_,(database *)actual.pos_.a_.a_);
  _local_28 = pstore::generation_container::begin((generation_container *)&expected.pos_);
  pstore::gsl::not_null<const_pstore::database_*>::not_null(&local_48,(database *)actual.pos_.a_.a_)
  ;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::database::footer_pos((database *)actual.pos_.a_.a_);
  pstore::generation_iterator::generation_iterator
            ((generation_iterator *)local_40,local_48,
             (typed_address<pstore::trailer>)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::internal::EqHelper::
  Compare<pstore::generation_iterator,_pstore::generation_iterator,_nullptr>
            ((EqHelper *)local_60,"expected","actual",(generation_iterator *)local_40,
             (generation_iterator *)local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_generation_iterator.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST_F (GenerationIterator, GenerationContainerBegin) {
    this->add_transaction ();

    auto & d = this->db ();
    generation_iterator const actual = generation_container{d}.begin ();
    generation_iterator const expected = generation_iterator{&d, d.footer_pos ()};
    EXPECT_EQ (expected, actual);
}